

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

void p_str(parse *p)

{
  char *pcVar1;
  
  if (p->end <= p->next) {
    if (p->error == 0) {
      p->error = 0xe;
    }
    p->next = nuls;
    p->end = nuls;
  }
  while (pcVar1 = p->next, pcVar1 < p->end) {
    p->next = pcVar1 + 1;
    ordinary(p,(int)*pcVar1);
  }
  return;
}

Assistant:

static void
p_str(p)
register struct parse *p;
{
	REQUIRE(MORE(), REG_EMPTY);
	while (MORE())
		ordinary(p, GETNEXT());
}